

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicDispatchIndirect::Run(BasicDispatchIndirect *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  undefined4 *puVar4;
  GLuint *ptr;
  GLuint data2 [4];
  GLuint data [8];
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicDispatchIndirect *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nuniform uvec3 g_global_size;\nvoid main() {\n  uint global_index = gl_GlobalInvocationID.x +\n                      gl_GlobalInvocationID.y * g_global_size.x +\n                      gl_GlobalInvocationID.z * g_global_size.x * g_global_size.y;\n  if (gl_NumWorkGroups != g_global_size) {\n    g_output[global_index] = 0xffffu;\n    return;\n  }\n  g_output[global_index] = global_index;\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nuniform uvec3 g_global_size;\nvoid main() {\n  uint global_index = gl_GlobalInvocationID.x +\n                      gl_GlobalInvocationID.y * g_global_size.x +\n                      gl_GlobalInvocationID.z * g_global_size.x * g_global_size.y;\n  if (gl_NumWorkGroups != g_global_size) {\n    g_output[global_index] = 0xffffu;\n    return;\n  }\n  g_output[global_index] = global_index;\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    bVar1 = CheckBinding(this,0);
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_dispatch_buffer);
      data2[2] = 1;
      data2[3] = 2;
      ptr = (GLuint *)0x100000003;
      data2[0] = 4;
      data2[1] = 4;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0x20,data2 + 2,0x88e0);
      bVar1 = CheckBinding(this,this->m_dispatch_buffer[0]);
      if (bVar1) {
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ee,this->m_dispatch_buffer[1]);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ee,0x10,&ptr,0x88e1);
        bVar1 = CheckBinding(this,this->m_dispatch_buffer[1]);
        if (bVar1) {
          glu::CallLogWrapper::glUseProgram
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,this->m_program);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90ee,this->m_dispatch_buffer[0]);
          GVar3 = glu::CallLogWrapper::glGetUniformLocation
                            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              super_CallLogWrapper,this->m_program,"g_global_size");
          glu::CallLogWrapper::glUniform3ui
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar3,1,2,3);
          bVar1 = RunIteration(this,0,6);
          if (bVar1) {
            GVar3 = glu::CallLogWrapper::glGetUniformLocation
                              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,this->m_program,"g_global_size");
            glu::CallLogWrapper::glUniform3ui
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,GVar3,2,3,4);
            bVar1 = RunIteration(this,4,0x18);
            if (bVar1) {
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,this->m_program,"g_global_size");
              glu::CallLogWrapper::glUniform3ui
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,GVar3,4,5,6);
              bVar1 = RunIteration(this,0xc,0x78);
              if (bVar1) {
                glu::CallLogWrapper::glBufferSubData
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x90ee,0x14,0xc,data2 + 2);
                GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                  (&(this->super_ComputeShaderBase).super_SubcaseBase.
                                    super_GLWrapper.super_CallLogWrapper,this->m_program,
                                   "g_global_size");
                glu::CallLogWrapper::glUniform3ui
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,GVar3,1,2,3);
                bVar1 = RunIteration(this,0x14,6);
                if (bVar1) {
                  puVar4 = (undefined4 *)
                           glu::CallLogWrapper::glMapBufferRange
                                     (&(this->super_ComputeShaderBase).super_SubcaseBase.
                                       super_GLWrapper.super_CallLogWrapper,0x90ee,0,0x10,2);
                  *puVar4 = 4;
                  puVar4[1] = 4;
                  puVar4[2] = 4;
                  glu::CallLogWrapper::glUnmapBuffer
                            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              super_CallLogWrapper,0x90ee);
                  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                    (&(this->super_ComputeShaderBase).super_SubcaseBase.
                                      super_GLWrapper.super_CallLogWrapper,this->m_program,
                                     "g_global_size");
                  glu::CallLogWrapper::glUniform3ui
                            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              super_CallLogWrapper,GVar3,4,4,4);
                  bVar1 = RunIteration(this,0,0x40);
                  if (bVar1) {
                    glu::CallLogWrapper::glBindBuffer
                              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x90ee,this->m_dispatch_buffer[1]);
                    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                      (&(this->super_ComputeShaderBase).super_SubcaseBase.
                                        super_GLWrapper.super_CallLogWrapper,this->m_program,
                                       "g_global_size");
                    glu::CallLogWrapper::glUniform3ui
                              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,GVar3,1,4,4);
                    bVar1 = RunIteration(this,4,0x10);
                    if (bVar1) {
                      glu::CallLogWrapper::glDeleteBuffers
                                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,2,this->m_dispatch_buffer);
                      memset(this->m_dispatch_buffer,0,8);
                      bVar1 = CheckBinding(this,0);
                      if (bVar1) {
                        this_local = (BasicDispatchIndirect *)0x0;
                      }
                      else {
                        this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicDispatchIndirect *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "uniform uvec3 g_global_size;" NL "void main() {" NL "  uint global_index = gl_GlobalInvocationID.x +" NL
			   "                      gl_GlobalInvocationID.y * g_global_size.x +" NL
			   "                      gl_GlobalInvocationID.z * g_global_size.x * g_global_size.y;" NL
			   "  if (gl_NumWorkGroups != g_global_size) {" NL "    g_output[global_index] = 0xffffu;" NL
			   "    return;" NL "  }" NL "  g_output[global_index] = global_index;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		if (!CheckBinding(0))
			return ERROR;

		glGenBuffers(2, m_dispatch_buffer);

		const GLuint data[]  = { 1, 2, 3, 4, 5, 6, 7, 8 };
		const GLuint data2[] = { 3, 1, 4, 4 };

		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[0]);
		glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(data), data, GL_STREAM_DRAW);
		if (!CheckBinding(m_dispatch_buffer[0]))
			return ERROR;

		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[1]);
		glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(data2), data2, GL_STREAM_READ);
		if (!CheckBinding(m_dispatch_buffer[1]))
			return ERROR;

		glUseProgram(m_program);
		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[0]);

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 1, 2, 3);
		if (!RunIteration(0, 6))
			return ERROR;

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 2, 3, 4);
		if (!RunIteration(4, 24))
			return ERROR;

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 4, 5, 6);
		if (!RunIteration(12, 120))
			return ERROR;

		glBufferSubData(GL_DISPATCH_INDIRECT_BUFFER, 20, 12, data);
		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 1, 2, 3);
		if (!RunIteration(20, 6))
			return ERROR;

		GLuint* ptr = static_cast<GLuint*>(
			glMapBufferRange(GL_DISPATCH_INDIRECT_BUFFER, 0, sizeof(GLuint) * 4, GL_MAP_WRITE_BIT));
		*ptr++ = 4;
		*ptr++ = 4;
		*ptr++ = 4;
		glUnmapBuffer(GL_DISPATCH_INDIRECT_BUFFER);

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 4, 4, 4);
		if (!RunIteration(0, 64))
			return ERROR;

		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[1]);

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 1, 4, 4);
		if (!RunIteration(4, 16))
			return ERROR;

		glDeleteBuffers(2, m_dispatch_buffer);
		memset(m_dispatch_buffer, 0, sizeof(m_dispatch_buffer));

		if (!CheckBinding(0))
			return ERROR;

		return NO_ERROR;
	}